

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::Identification::Identification(Identification *this,Dictionary *d)

{
  byte_t *value;
  UL local_48;
  Dictionary *local_18;
  Dictionary *d_local;
  Identification *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  InterchangeObject::InterchangeObject(&this->super_InterchangeObject,d);
  (this->super_InterchangeObject).super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__Identification_00339c20;
  Kumu::UUID::UUID(&this->ThisGenerationUID);
  UTF16String::UTF16String(&this->CompanyName);
  UTF16String::UTF16String(&this->ProductName);
  VersionType::VersionType(&this->ProductVersion);
  UTF16String::UTF16String(&this->VersionString);
  Kumu::UUID::UUID(&this->ProductUID);
  Kumu::Timestamp::Timestamp(&this->ModificationDate);
  VersionType::VersionType(&this->ToolkitVersion);
  optional_property<ASDCP::MXF::UTF16String>::optional_property(&this->Platform);
  if ((this->super_InterchangeObject).m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_InterchangeObject).m_Dict,MDD_Identification);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_InterchangeObject).super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0xa3,"ASDCP::MXF::Identification::Identification(const Dictionary *)");
}

Assistant:

Identification::Identification(const Dictionary* d) : InterchangeObject(d)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_Identification);
}